

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O3

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage)

{
  INT32U IVar1;
  CHAR CVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  
  IVar1 = pImage->widthStep;
  iVar6 = IVar1 + 1;
  iVar7 = 1;
  iVar3 = 0;
  uVar4 = 300;
  do {
    lVar8 = 0;
    do {
      uVar5 = pImage->imageData[(uint)(iVar6 + (int)lVar8)] ^ 0xff;
      iVar3 = iVar3 + uVar5;
      if (uVar4 < uVar5) {
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    iVar7 = iVar7 + 1;
    iVar6 = iVar6 + IVar1;
  } while (iVar7 != 5);
  iVar6 = IVar1 + 9;
  iVar7 = 1;
  do {
    lVar8 = 0;
    do {
      uVar5 = pImage->imageData[(uint)(iVar6 + (int)lVar8)] ^ 0xff;
      iVar3 = iVar3 + uVar5;
      if (uVar4 < uVar5) {
        uVar5 = uVar4;
      }
      uVar4 = uVar5;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 5);
    iVar7 = iVar7 + 1;
    iVar6 = iVar6 + IVar1;
  } while (iVar7 != 5);
  CVar2 = 'I';
  if (0x524 < iVar3 + uVar4 * -0x24) {
    CVar2 = 'T';
  }
  return CVar2;
}

Assistant:

CHAR LocalRegionGrayValuePredictTI(IplImage *pImage) {
    INT32U row, col, locate_value, sum_value = 0, min_value = 300;
//    区域 [1:5,1:6], 4*5
    for (row = 1; row < 5; row++) {
        for (col = 1; col < 6; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    区域 [1:5,9:14],4*4
    for (row = 1; row < 5; row++) {
        for (col = 9; col < 14; col++) {
            // get the pixel, 黑白颠倒
            locate_value = (INT32U) (255 - pImage->imageData[row * pImage->widthStep + col]);
            sum_value += locate_value;
            if (locate_value < min_value) {
                min_value = locate_value;
            }
        }
    }
//    总共40个像素点：4*5+4*4=36
//    printf("%d,%d,%d\n",sum_value,min_value,(sum_value-min_value*36));
    if (sum_value - min_value * 36 > 1316)
        return 'T';
    else
        return 'I';
}